

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestXmmRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86XmmReg_x86Reg *fun)

{
  int iVar1;
  uint local_38;
  uint local_34;
  uint reg;
  uint xmm;
  uchar *start;
  _func_int_uchar_ptr_x86XmmReg_x86Reg *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 9; local_38 = local_38 + 1) {
      EMIT_OP_REG_REG(ctx,op,testXmmRegs[local_34],testRegs[local_38]);
      iVar1 = (*fun)(puStack_18,testXmmRegs[local_34],testRegs[local_38]);
      puStack_18 = puStack_18 + iVar1;
    }
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestXmmRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86XmmReg dst, x86Reg src))
{
	unsigned char *start = stream;

	for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
	{
		for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
		{
			EMIT_OP_REG_REG(ctx, op, testXmmRegs[xmm], testRegs[reg]);
			stream += fun(stream, testXmmRegs[xmm], testRegs[reg]);
		}
	}

	return int(stream - start);
}